

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

char * ossl_strerror(unsigned_long error,char *buf,size_t size)

{
  char *__src;
  
  *buf = '\0';
  ERR_error_string_n(error,buf,0x100);
  if (*buf == '\0') {
    __src = "Unknown error";
    if (error == 0) {
      __src = "No error";
    }
    strncpy(buf,__src,0x100);
    buf[0xff] = '\0';
  }
  return buf;
}

Assistant:

static char *ossl_strerror(unsigned long error, char *buf, size_t size)
{
  if(size)
    *buf = '\0';

#ifdef OPENSSL_IS_BORINGSSL
  ERR_error_string_n((uint32_t)error, buf, size);
#else
  ERR_error_string_n(error, buf, size);
#endif

  if(size > 1 && !*buf) {
    strncpy(buf, (error ? "Unknown error" : "No error"), size);
    buf[size - 1] = '\0';
  }

  return buf;
}